

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O3

void __thiscall
Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
_solve_impl<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,3,3,0,3,3>>
          (PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          *rhs,Matrix<double,_3,_3,_0,_3,_3> *dst)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_20;
  
  if (this[0x41] == (PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0) {
    __assert_fail("m_isInitialized && \"PartialPivLU is not initialized.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/LU/PartialPivLU.h"
                  ,0x99,
                  "const PermutationType &Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>::permutationP() const [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  lVar1 = (rhs->m_rows).m_value;
  if (*(long *)(this + 0x20) == lVar1) {
    if ((lVar1 == 3) && ((rhs->m_cols).m_value == 3)) {
      lVar1 = *(long *)(this + 0x18);
      lVar2 = 0;
      do {
        uVar3 = (ulong)*(uint *)(lVar1 + lVar2);
        if (2 < uVar3) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 3, 3>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
                       );
        }
        uVar5 = 0x3ff00000;
        uVar4 = uVar5;
        if (lVar2 != 0) {
          uVar4 = 0;
        }
        (dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [uVar3] = (double)((ulong)uVar4 << 0x20);
        uVar4 = uVar5;
        if (lVar2 != 4) {
          uVar4 = 0;
        }
        (dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [uVar3 + 3] = (double)((ulong)uVar4 << 0x20);
        if (lVar2 != 8) {
          uVar5 = 0;
        }
        (dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [uVar3 + 6] = (double)((ulong)uVar5 << 0x20);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0xc);
      local_20 = this;
      TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>const,5u,Eigen::Dense>::
      solveInPlace<1,Eigen::Matrix<double,3,3,0,3,3>>
                ((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>const,5u,Eigen::Dense> *)
                 &local_20,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)dst);
      local_20 = this;
      TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>const,2u,Eigen::Dense>::
      solveInPlace<1,Eigen::Matrix<double,3,3,0,3,3>>
                ((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>const,2u,Eigen::Dense> *)
                 &local_20,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)dst);
      return;
    }
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 3>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 3>]"
                 );
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Product.h"
                ,0x62,
                "Eigen::Product<Eigen::PermutationMatrix<-1, -1>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>, 2>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::PermutationMatrix<-1, -1>, _Rhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>, Option = 2]"
               );
}

Assistant:

inline const PermutationType& permutationP() const
    {
      eigen_assert(m_isInitialized && "PartialPivLU is not initialized.");
      return m_p;
    }